

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<long_long,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,longlong value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  StringRef sep_00;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  CharPtr pwVar4;
  lconv *plVar5;
  wchar_t *pwVar6;
  ulong in_RSI;
  undefined8 in_RDI;
  CharPtr p_4;
  uint size;
  StringRef sep;
  uint num_digits_4;
  wchar_t *p_3;
  uint num_digits_3;
  UnsignedType n_2;
  wchar_t *p_2;
  uint num_digits_2;
  UnsignedType n_1;
  char *digits;
  wchar_t *p_1;
  uint num_digits_1;
  UnsignedType n;
  CharPtr p;
  uint num_digits;
  char prefix [4];
  UnsignedType abs_value;
  uint prefix_size;
  char *in_stack_fffffffffffffeb8;
  BasicStringRef<char> *in_stack_fffffffffffffec0;
  wchar_t *in_stack_fffffffffffffed0;
  char *local_100;
  char local_f1;
  uint uVar7;
  char *in_stack_ffffffffffffff20;
  FormatSpec *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff34;
  BasicWriter<wchar_t> *in_stack_ffffffffffffff38;
  undefined7 local_c0;
  char in_stack_ffffffffffffff47;
  LConvCheck<char_*lconv::*,_&lconv::thousands_sep> local_a9;
  StringRef local_a8;
  BasicStringRef<char> local_98;
  uint local_84;
  wchar_t *local_80;
  int local_74;
  ulong local_70;
  wchar_t *local_68;
  int local_5c;
  ulong local_58;
  wchar_t *local_48;
  int local_3c;
  ulong local_38;
  wchar_t *local_30;
  uint local_28;
  char local_24 [4];
  ulong local_20;
  uint local_14;
  
  uVar7 = (uint)((ulong)in_RDI >> 0x20);
  local_14 = 0;
  local_20 = in_RSI;
  memset(local_24,0,4);
  bVar1 = internal::is_negative<long_long>(0x1e079d);
  if (bVar1) {
    local_24[0] = '-';
    local_14 = local_14 + 1;
    local_20 = -local_20;
  }
  else {
    bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,2);
      local_f1 = '+';
      if (!bVar1) {
        local_f1 = ' ';
      }
      local_24[0] = local_f1;
      local_14 = local_14 + 1;
    }
  }
  cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
  if (cVar2 == '\0') {
LAB_001e08a8:
    local_28 = internal::count_digits((uint64_t)in_stack_fffffffffffffec0);
    pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,uVar7);
    local_30 = pwVar4 + 1;
    get(local_30);
    internal::format_decimal<unsigned_long,wchar_t>
              ((wchar_t *)in_stack_fffffffffffffec0,(unsigned_long)in_stack_fffffffffffffeb8,0);
    return;
  }
  if (cVar2 == 'B') {
LAB_001e0a83:
    local_58 = local_20;
    bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,8);
    if (bVar1) {
      uVar3 = (ulong)local_14;
      local_14 = local_14 + 1;
      local_24[uVar3] = '0';
      cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
      uVar3 = (ulong)local_14;
      local_14 = local_14 + 1;
      local_24[uVar3] = cVar2;
    }
    local_5c = 0;
    do {
      local_5c = local_5c + 1;
      local_58 = local_58 >> 1;
    } while (local_58 != 0);
    pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,uVar7);
    local_68 = get(pwVar4);
    local_58 = local_20;
    do {
      *local_68 = ((uint)local_58 & 1) + L'0';
      local_58 = local_58 >> 1;
      local_68 = local_68 + -1;
    } while (local_58 != 0);
  }
  else {
    if (cVar2 != 'X') {
      if (cVar2 == 'b') goto LAB_001e0a83;
      if (cVar2 == 'd') goto LAB_001e08a8;
      if (cVar2 == 'n') {
        local_84 = internal::count_digits((uint64_t)in_stack_fffffffffffffec0);
        BasicStringRef<char>::BasicStringRef(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        plVar5 = localeconv();
        internal::LConvCheck<char_*lconv::*,_&lconv::thousands_sep>::LConvCheck(&local_a9,0);
        local_a8 = internal::thousands_sep<lconv>(plVar5);
        local_98.data_ = local_a8.data_;
        local_98.size_ = local_a8.size_;
        uVar3 = (ulong)local_84;
        BasicStringRef<char>::size(&local_98);
        pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                           (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                            in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,uVar7);
        uVar7 = (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20);
        pwVar6 = get(pwVar4 + 1);
        sep_00.size_ = local_98.size_;
        sep_00.data_ = local_98.data_;
        internal::ThousandsSep::ThousandsSep((ThousandsSep *)&stack0xffffffffffffff30,sep_00);
        thousands_sep.sep_.size_ = uVar3;
        thousands_sep.sep_.data_ = (char *)plVar5;
        thousands_sep._16_8_ = pwVar6;
        internal::format_decimal<unsigned_long,wchar_t,fmt::internal::ThousandsSep>
                  (in_stack_fffffffffffffed0,CONCAT17(in_stack_ffffffffffffff47,local_c0),uVar7,
                   thousands_sep);
        return;
      }
      if (cVar2 == 'o') {
        local_70 = local_20;
        bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,8);
        if (bVar1) {
          uVar3 = (ulong)local_14;
          local_14 = local_14 + 1;
          local_24[uVar3] = '0';
        }
        local_74 = 0;
        do {
          local_74 = local_74 + 1;
          local_70 = local_70 >> 3;
        } while (local_70 != 0);
        pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                           (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                            in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,uVar7);
        local_80 = get(pwVar4);
        local_70 = local_20;
        do {
          *local_80 = ((uint)local_70 & 7) + L'0';
          local_70 = local_70 >> 3;
          local_80 = local_80 + -1;
        } while (local_70 != 0);
        return;
      }
      if (cVar2 != 'x') {
        FormatSpec::type((FormatSpec *)&stack0x00000008);
        FormatSpec::flag((FormatSpec *)&stack0x00000008,0x10);
        internal::report_unknown_type(in_stack_ffffffffffffff47,(char *)in_stack_ffffffffffffff38);
        return;
      }
    }
    local_38 = local_20;
    bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,8);
    if (bVar1) {
      uVar3 = (ulong)local_14;
      local_14 = local_14 + 1;
      local_24[uVar3] = '0';
      cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
      uVar3 = (ulong)local_14;
      local_14 = local_14 + 1;
      local_24[uVar3] = cVar2;
    }
    local_3c = 0;
    do {
      local_3c = local_3c + 1;
      local_38 = local_38 >> 4;
    } while (local_38 != 0);
    pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,uVar7);
    local_48 = get(pwVar4);
    local_38 = local_20;
    cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
    if (cVar2 == 'x') {
      local_100 = "0123456789abcdef";
    }
    else {
      local_100 = "0123456789ABCDEF";
    }
    do {
      *local_48 = (int)local_100[local_38 & 0xf];
      local_38 = local_38 >> 4;
      local_48 = local_48 + -1;
    } while (local_38 != 0);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}